

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O3

void text_drawborder(t_text *x,_glist *glist,char *tag,int width2,int height2,int firsttime)

{
  uint uVar1;
  _glist *p_Var2;
  _glist *x_00;
  _glist *extraout_RAX;
  _glist *extraout_RAX_00;
  _glist *extraout_RAX_01;
  int iVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 in_register_00000084;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  char *pcVar15;
  int y2;
  int x2;
  ulong local_110;
  int y1;
  ulong local_100;
  int x1;
  ulong local_f0;
  char *tags [2];
  char tagR [128];
  
  sprintf(tagR,"%sR",tag,CONCAT44(in_register_0000000c,width2),
          CONCAT44(in_register_00000084,height2));
  text_getrect(&x->te_g,glist,&x1,&y1,&x2,&y2);
  iVar14 = y1;
  iVar13 = y2;
  switch(x->field_0x2e & 3) {
  case 0:
    if ((glist->field_0xe8 & 0x20) != 0) {
      tags[1] = "commentbar";
      tags[0] = tagR;
      p_Var2 = glist_getcanvas((_glist *)"commentbar");
      uVar8 = (ulong)(uint)x2;
      if (firsttime == 0) {
        pdgui_vmess((char *)0x0,"crs iiii",p_Var2,"coords",tagR,uVar8,(ulong)(uint)y1,uVar8,
                    (ulong)(uint)y2);
      }
      else {
        pdgui_vmess((char *)0x0,"crr iiii rS",p_Var2,"create","line",uVar8,(ulong)(uint)y1,uVar8,
                    (ulong)(uint)y2,"-tags",2,tags);
      }
    }
    goto LAB_0016026a;
  case 1:
    pcVar15 = "\"\"";
    if ((x->te_g).g_pd == text_class) {
      pcVar15 = "-";
    }
    tags[1] = "obj";
    tags[0] = tagR;
    p_Var2 = glist_getcanvas((_glist *)0x1b9978);
    uVar8 = (ulong)(uint)x1;
    uVar7 = (ulong)(uint)y1;
    uVar6 = (ulong)(uint)x2;
    uVar10 = (ulong)(uint)y2;
    if (firsttime == 0) {
      pdgui_vmess((char *)0x0,"crs iiiiiiiiii",p_Var2,"coords",tagR,uVar8,uVar7,uVar6,uVar7,uVar6,
                  uVar10,uVar8,uVar10,uVar8,uVar7);
      p_Var2 = glist_getcanvas(x_00);
      pdgui_vmess((char *)0x0,"crs rr",p_Var2,"itemconfigure",tagR,"-dash",pcVar15);
    }
    else {
      local_110 = (ulong)(uint)glist->gl_zoom;
      pdgui_vmess((char *)0x0,"crr iiiiiiiiii rr ri rr rS",p_Var2,"create","line",uVar8,uVar7,uVar6,
                  uVar7,uVar6,uVar10,uVar8,uVar10,uVar8,uVar7,"-dash",pcVar15,"-width",local_110,
                  "-capstyle","projecting","-tags",2,tags);
    }
    goto LAB_0016026a;
  case 2:
    uVar5 = (ulong)(uint)y2;
    uVar7 = (ulong)(uint)y1;
    iVar4 = y2 - y1;
    iVar3 = iVar4 + 3;
    if (-1 < iVar4) {
      iVar3 = iVar4;
    }
    tags[1] = "msg";
    uVar11 = iVar3 >> 2;
    uVar1 = glist->gl_zoom * 10;
    if (SBORROW4(uVar11,uVar1) == (int)(uVar11 + glist->gl_zoom * -10) < 0) {
      uVar11 = uVar1;
    }
    tags[0] = tagR;
    p_Var2 = glist_getcanvas((_glist *)(ulong)uVar1);
    uVar10 = (ulong)(uint)x2;
    uVar9 = (ulong)(x2 + uVar11);
    uVar6 = (ulong)(iVar13 - uVar11);
    uVar12 = (ulong)(uVar11 + iVar14);
    uVar8 = (ulong)(uint)x1;
    local_110 = CONCAT44(local_110._4_4_,firsttime);
    if (firsttime == 0) {
      pdgui_vmess((char *)0x0,"crs iiiiiiiiiiiiii",p_Var2,"coords",tagR,uVar8,uVar7,uVar9,uVar7,
                  uVar10,uVar12,uVar10,uVar6,uVar9,uVar5,uVar8,uVar5,uVar8,uVar7);
    }
    else {
      uVar5 = (ulong)(uint)glist->gl_zoom;
      local_100 = uVar9;
      local_f0 = uVar5;
LAB_001600b5:
      pdgui_vmess((char *)0x0,"crr iiiiiiiiiiiiii ri rr rS",p_Var2,"create","line",uVar8,uVar7,uVar9
                  ,uVar7,uVar10,uVar12,uVar10,uVar6,uVar9,(ulong)(uint)iVar13,uVar8,
                  (ulong)(uint)iVar13,uVar8,uVar7,"-width",uVar5,"-capstyle","projecting","-tags",2,
                  tags);
    }
    break;
  case 3:
    local_110 = CONCAT44(local_110._4_4_,firsttime);
    iVar14 = (*(uint *)&x[2].te_outlet >> 3 & 1) * glist->gl_zoom;
    uVar8 = (ulong)(uint)(x1 + iVar14);
    local_100 = (ulong)(uint)(iVar14 + y1);
    if (*(int *)&x[1].te_g.g_pd - 1U < 2) {
      tags[1] = "atom";
      uVar7 = (ulong)(uint)y2;
      iVar3 = y2 - y1;
      iVar13 = iVar3 + 3;
      if (-1 < iVar3) {
        iVar13 = iVar3;
      }
      tags[0] = tagR;
      p_Var2 = glist_getcanvas((_glist *)(ulong)(uint)y1);
      uVar6 = (ulong)(uint)x2;
      local_f0 = (ulong)(uint)(x2 - (iVar13 >> 2));
      uVar10 = (ulong)(uint)((iVar13 >> 2) + (int)local_100);
      if ((int)local_110 != 0) {
        pdgui_vmess((char *)0x0,"crr iiiiiiiiiiii ri rr rS",p_Var2,"create","line",uVar8,local_100,
                    local_f0,local_100,uVar6,uVar10,uVar6,uVar7,uVar8,uVar7,uVar8,local_100,"-width"
                    ,(ulong)(uint)(iVar14 + glist->gl_zoom),"-capstyle","projecting","-tags",2,tags)
        ;
        break;
      }
      pdgui_vmess((char *)0x0,"crs iiiiiiiiiiii",p_Var2,"coords",tagR,uVar8,local_100,local_f0,
                  local_100,uVar6,uVar10,uVar6,uVar7,uVar8,uVar7,uVar8,local_100);
      p_Var2 = extraout_RAX;
    }
    else {
      tags[1] = "atom";
      uVar7 = (ulong)(uint)y2;
      iVar4 = y2 - y1;
      iVar3 = iVar4 + 3;
      if (-1 < iVar4) {
        iVar3 = iVar4;
      }
      iVar3 = iVar3 >> 2;
      tags[0] = tagR;
      p_Var2 = glist_getcanvas((_glist *)(ulong)(uint)y1);
      uVar10 = (ulong)(uint)x2;
      uVar9 = (ulong)(uint)(x2 - iVar3);
      uVar6 = (ulong)(uint)(iVar13 - iVar3);
      uVar12 = (ulong)(uint)(iVar3 + (int)local_100);
      local_f0 = uVar10;
      if ((int)local_110 != 0) {
        uVar5 = (ulong)(uint)(iVar14 + glist->gl_zoom);
        uVar7 = local_100;
        goto LAB_001600b5;
      }
      pdgui_vmess((char *)0x0,"crs iiiiiiiiiiiiii",p_Var2,"coords",tagR,uVar8,local_100,uVar9,
                  local_100,uVar10,uVar12,uVar10,uVar6,uVar9,uVar7,uVar8,uVar7,uVar8,local_100);
      p_Var2 = extraout_RAX_00;
    }
    p_Var2 = glist_getcanvas(p_Var2);
    pdgui_vmess((char *)0x0,"crs ri",p_Var2,"itemconfigure",tagR,"-width",
                (ulong)(uint)(iVar14 + glist->gl_zoom));
  }
  firsttime = (int)local_110;
LAB_0016026a:
  p_Var2 = (_glist *)pd_checkobject((t_pd *)x);
  if (p_Var2 != (_glist *)0x0) {
    glist_drawiofor(glist,(t_object *)p_Var2,firsttime,tag,x1,y1,x2,y2);
    p_Var2 = extraout_RAX_01;
  }
  if (firsttime != 0) {
    p_Var2 = glist_getcanvas(p_Var2);
    pdgui_vmess((char *)0x0,"crr",p_Var2,"raise","cord");
  }
  return;
}

Assistant:

void text_drawborder(t_text *x, t_glist *glist,
    const char *tag, int width2, int height2, int firsttime)
{
    t_object *ob;
    int x1, y1, x2, y2, width, height, corner;
    char tagR[128];
    sprintf(tagR, "%sR", tag);
    text_getrect(&x->te_g, glist, &x1, &y1, &x2, &y2);
    width = x2 - x1;
    height = y2 - y1;
    if (x->te_type == T_OBJECT)
    {
        char *pattern = ((pd_class(&x->te_pd) == text_class) ? "-" : "\"\"");
        char *tags[] = {tagR, "obj"};
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiii rr ri rr rS",
                glist_getcanvas(glist), "create", "line",
                x1, y1,  x2, y1,  x2, y2,  x1, y2,  x1, y1,
                "-dash", pattern,
                "-width", glist->gl_zoom,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
        {
            pdgui_vmess(0, "crs iiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1, y1,  x2, y1,  x2, y2,  x1, y2,  x1, y1);
            pdgui_vmess(0, "crs rr",
                glist_getcanvas(glist), "itemconfigure", tagR,
                "-dash", pattern);
        }
    }
    else if (x->te_type == T_MESSAGE)
    {
        char *tags[] = {tagR, "msg"};
        corner = ((y2-y1)/4);
        if (corner > 10*glist->gl_zoom)
            corner = 10*glist->gl_zoom; /* looks bad if too big */
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiiiiiii ri rr rS",
                glist_getcanvas(glist), "create", "line",
                x1, y1,  x2+corner, y1,  x2, y1+corner,  x2, y2-corner,  x2+corner, y2,  x1, y2,  x1, y1,
                "-width", glist->gl_zoom,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
            pdgui_vmess(0, "crs iiiiiiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1, y1,  x2+corner, y1,  x2, y1+corner,  x2, y2-corner,  x2+corner, y2,  x1, y2,  x1, y1);
    }
    else if (x->te_type == T_ATOM && (((t_gatom *)x)->a_flavor == A_FLOAT ||
           ((t_gatom *)x)->a_flavor == A_SYMBOL))
    {
            /* number or symbol */
        int grabbed = glist->gl_zoom * ((t_gatom *)x)->a_grabbed;
        int x1p = x1 + grabbed, y1p = y1 + grabbed;
        char *tags[] = {tagR, "atom"};
        corner = ((y2-y1)/4);
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiiiii ri rr rS",
                glist_getcanvas(glist), "create", "line",
                x1p, y1p,  x2-corner, y1p,  x2, y1p+corner, x2, y2,  x1p, y2,  x1p, y1p,
                "-width", glist->gl_zoom+grabbed,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
        {
            pdgui_vmess(0, "crs iiiiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1p, y1p,  x2-corner, y1p,  x2, y1p+corner,  x2, y2,  x1p, y2,  x1p, y1p);
            pdgui_vmess(0, "crs ri",
                glist_getcanvas(glist), "itemconfigure", tagR,
                "-width", glist->gl_zoom+grabbed);
        }
    }
    else if (x->te_type == T_ATOM ) /* list (ATOM but not float or symbol) */
    {
        int grabbed = glist->gl_zoom * ((t_gatom *)x)->a_grabbed;
        int x1p = x1 + grabbed, y1p = y1 + grabbed;
        char *tags[] = {tagR, "atom"};
        corner = ((y2-y1)/4);
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiiiiiii ri rr rS",
                glist_getcanvas(glist),
                "create", "line",
                x1p, y1p,  x2-corner, y1p,  x2, y1p+corner,  x2, y2-corner,  x2-corner, y2,  x1p, y2,  x1p, y1p,
                "-width", glist->gl_zoom+grabbed,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
        {
            pdgui_vmess(0, "crs iiiiiiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1p,y1p, x2-corner,y1p, x2,y1p+corner, x2,y2-corner, x2-corner,y2, x1p,y2, x1p,y1p);
            pdgui_vmess(0, "crs ri",
                glist_getcanvas(glist), "itemconfigure", tagR,
                "-width", glist->gl_zoom+grabbed);
        }
    }
        /* for comments, just draw a bar on RHS if unlocked; when a visible
        canvas is unlocked we have to call this anew on all comments, and when
        locked we erase them all via the annoying "commentbar" tag. */
    else if (x->te_type == T_TEXT && glist->gl_edit)
    {
        char *tags[] = {tagR, "commentbar"};
        if (firsttime)
            pdgui_vmess(0, "crr iiii rS",
                glist_getcanvas(glist), "create", "line",
                x2, y1,  x2, y2,
                "-tags", 2, tags);
        else
            pdgui_vmess(0, "crs iiii",
                glist_getcanvas(glist), "coords", tagR,
                x2, y1,  x2, y2);
    }
        /* draw inlets/outlets */

    if ((ob = pd_checkobject(&x->te_pd)))
        glist_drawiofor(glist, ob, firsttime, tag, x1, y1, x2, y2);
    if (firsttime) /* raise cords over everything else */
        pdgui_vmess(0, "crr", glist_getcanvas(glist), "raise", "cord");
}